

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O2

vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_> *
obj::load_from_stream<double>
          (vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>
           *__return_storage_ptr__,istream *is)

{
  double dVar1;
  double dVar2;
  char *pcVar3;
  int iVar4;
  long *plVar5;
  optional<int> oVar6;
  ulong uVar7;
  _Storage<int,_true> _Var8;
  ulong uVar9;
  double *pdVar10;
  pointer pVVar11;
  ulong uVar12;
  float fVar13;
  char *ptr;
  vector<bvh::v2::Tri<double,3ul>,std::allocator<bvh::v2::Tri<double,3ul>>> *local_4b8;
  float z;
  vector<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_> vertices;
  float y;
  undefined4 uStack_484;
  double dStack_480;
  double local_478;
  istream *local_470;
  float x;
  Vec<double,_3UL> local_450;
  char line [1024];
  
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.
  super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.
  super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.
  super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8 = (vector<bvh::v2::Tri<double,3ul>,std::allocator<bvh::v2::Tri<double,3ul>>> *)
              __return_storage_ptr__;
  local_470 = is;
  do {
    do {
      while( true ) {
        do {
          plVar5 = (long *)std::istream::getline((char *)is,(long)line);
          if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
            std::
            _Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>::
            ~_Vector_base(&vertices.
                           super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                         );
            return (vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_> *
                   )local_4b8;
          }
          ptr = strip_spaces(line);
        } while ((*ptr == '\0') || (*ptr == '#'));
        remove_eol(ptr);
        pcVar3 = ptr;
        if (*ptr == 'f') break;
        if ((*ptr == 'v') && (iVar4 = isspace((int)ptr[1]), iVar4 != 0)) {
          x = strtof(pcVar3 + 1,&ptr);
          fVar13 = strtof(ptr,&ptr);
          _y = (double)CONCAT44(uStack_484,fVar13);
          z = strtof(ptr,&ptr);
          std::vector<bvh::v2::Vec<double,3ul>,std::allocator<bvh::v2::Vec<double,3ul>>>::
          emplace_back<float&,float&,float&>
                    ((vector<bvh::v2::Vec<double,3ul>,std::allocator<bvh::v2::Vec<double,3ul>>> *)
                     &vertices,&x,&y,&z);
        }
      }
      iVar4 = isspace((int)ptr[1]);
    } while (iVar4 == 0);
    ptr = pcVar3 + 2;
    uVar12 = 0;
    pdVar10 = (double *)&x;
    while (oVar6 = read_index(&ptr), is = local_470,
          ((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
      _Var8._M_value =
           oVar6.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      if (_Var8._M_value < 0) {
        uVar7 = ((long)vertices.
                       super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vertices.
                      super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        uVar9 = (long)_Var8._M_value + uVar7;
      }
      else {
        uVar9 = (ulong)(_Var8._M_value + -1);
        uVar7 = ((long)vertices.
                       super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vertices.
                      super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      }
      if (uVar7 <= uVar9) {
        __assert_fail("j < vertices.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/test/load_obj.cpp"
                      ,0x50,
                      "std::vector<Tri<T, 3>> obj::load_from_stream(std::istream &) [T = double]");
      }
      local_478 = vertices.
                  super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9].values[2];
      _y = vertices.
           super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar9].values[0];
      dStack_480 = vertices.
                   super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].values[1];
      if (uVar12 < 2) {
        pVVar11 = vertices.
                  super__Vector_base<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar9;
        dVar1 = pVVar11->values[0];
        dVar2 = pVVar11->values[1];
        pdVar10[2] = pVVar11->values[2];
        *pdVar10 = dVar1;
        pdVar10[1] = dVar2;
      }
      else {
        std::vector<bvh::v2::Tri<double,3ul>,std::allocator<bvh::v2::Tri<double,3ul>>>::
        emplace_back<bvh::v2::Vec<double,3ul>&,bvh::v2::Vec<double,3ul>&,bvh::v2::Vec<double,3ul>&>
                  (local_4b8,(Vec<double,_3UL> *)&x,&local_450,(Vec<double,_3UL> *)&y);
        local_450.values[2] = local_478;
        local_450.values[0] = _y;
        local_450.values[1] = dStack_480;
      }
      uVar12 = uVar12 + 1;
      pdVar10 = pdVar10 + 3;
    }
  } while( true );
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_stream(std::istream& is) {
    static constexpr size_t max_line = 1024;
    char line[max_line];

    std::vector<Vec<T, 3>> vertices;
    std::vector<Tri<T, 3>> triangles;

    while (is.getline(line, max_line)) {
        char* ptr = strip_spaces(line);
        if (*ptr == '\0' || *ptr == '#')
            continue;
        remove_eol(ptr);
        if (*ptr == 'v' && std::isspace(ptr[1])) {
            auto x = std::strtof(ptr + 1, &ptr);
            auto y = std::strtof(ptr, &ptr);
            auto z = std::strtof(ptr, &ptr);
            vertices.emplace_back(x, y, z);
        } else if (*ptr == 'f' && std::isspace(ptr[1])) {
            Vec<T, 3> points[2];
            ptr += 2;
            for (size_t i = 0; ; ++i) {
                if (auto index = read_index(&ptr)) {
                    size_t j = *index < 0 ? vertices.size() + *index : *index - 1;
                    assert(j < vertices.size());
                    auto v = vertices[j];
                    if (i >= 2) {
                        triangles.emplace_back(points[0], points[1], v);
                        points[1] = v;
                    } else {
                        points[i] = v;
                    }
                } else {
                    break;
                }
            }
        }
    }

    return triangles;
}